

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O1

ParseTokenKind __thiscall
TTD::TextFormatReader::ScanNumber
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  int iVar1;
  char16_t *psz;
  bool bVar2;
  ParseTokenKind PVar3;
  double value;
  char16_t *local_30;
  char16 *end;
  LikelyNumberType likelyint;
  char16 c;
  
  end._6_2_ = L'\0';
  do {
    iVar1 = (this->super_FileReader).m_peekChar;
    if (iVar1 == -1) {
      bVar2 = FileReader::ReadRawChar(&this->super_FileReader,(char16 *)((long)&end + 6));
      if (!bVar2) {
LAB_00917bf7:
        PVar3 = Error;
        JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(charList,0);
        psz = (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).
              buffer;
        iVar1 = (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).
                count;
        psz[iVar1] = L'\0';
        (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count =
             iVar1 + 1;
        value = Js::NumberUtilities::StrToDbl<char16_t>
                          (psz,&local_30,(LikelyNumberType *)&end,false,false);
        if (psz != local_30) {
          bVar2 = Js::NumberUtilities::IsNan(value);
          PVar3 = Number;
          if (bVar2) {
            TTDAbort_unrecoverable_error("Bad result from string to double conversion");
          }
        }
        return PVar3;
      }
      (this->super_FileReader).m_peekChar = (uint)(ushort)end._6_2_;
    }
    else {
      end._6_2_ = (char16_t)iVar1;
    }
    if (end._6_2_ != L'.' && 9 < (ushort)(end._6_2_ + L'￐')) goto LAB_00917bf7;
    FileReader::ReadRawChar(&this->super_FileReader,(char16 *)((long)&end + 6));
    JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray(charList,0);
    iVar1 = (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count;
    (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).buffer[iVar1] =
         end._6_2_;
    (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count =
         iVar1 + 1;
  } while( true );
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanNumber(JsUtil::List<char16, HeapAllocator>& charList)
    {
        char16 c = _u('\0');
        while(this->PeekRawChar(&c) && ((_u('0') <= c && c <= _u('9')) || (c == _u('.'))))
        {
            this->ReadRawChar(&c);
            charList.Add(c);
        }

        // Null-terminate the list before we try to use the buffer as a string.
        charList.Add(_u('\0'));

        LikelyNumberType likelyint; //we don't care about this just want to know that it is convertable to a number
        const char16* end;
        const char16* start = charList.GetBuffer();
        double val = Js::NumberUtilities::StrToDbl<char16>(start, &end, likelyint);
        if(start == end)
        {
            return NSTokens::ParseTokenKind::Error;
        }
        TTDAssert(!Js::JavascriptNumber::IsNan(val), "Bad result from string to double conversion");

        return NSTokens::ParseTokenKind::Number;
    }